

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O1

aom_noise_status_t
aom_noise_model_update
          (aom_noise_model_t *noise_model,uint8_t **data,uint8_t **denoised,int w,int h,int *stride,
          int *chroma_sub_log2,uint8_t *flat_blocks,int block_size)

{
  aom_noise_strength_solver_t *solver;
  int *piVar1;
  aom_noise_state_t *state;
  aom_noise_state_t *state_00;
  size_t sVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  int (*paiVar6) [2];
  double dVar7;
  bool bVar8;
  ushort uVar9;
  ushort uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  void *memblk;
  ulong uVar16;
  long lVar17;
  double *pdVar18;
  bool bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  long lVar28;
  double *pdVar29;
  uint uVar30;
  uint uVar31;
  long lVar32;
  uint8_t *puVar33;
  uint uVar34;
  int iVar35;
  uint uVar36;
  ulong uVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  ulong uVar42;
  uint uVar43;
  int iVar44;
  uint uVar45;
  uint8_t *puVar46;
  uint uVar47;
  ulong uVar48;
  int max_h;
  int iVar49;
  int iVar50;
  ulong uVar51;
  uint uVar52;
  uint8_t *puVar53;
  long lVar54;
  uint8_t *puVar55;
  int max_w;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  byte *local_180;
  ulong local_160;
  ulong local_140;
  int *local_128;
  uint8_t *local_110;
  byte local_90 [4];
  int local_8c;
  aom_noise_state_t *local_88;
  aom_noise_state_t *local_80;
  ulong local_78;
  long local_70;
  double local_68;
  undefined8 uStack_60;
  byte *local_50;
  long local_48;
  long local_40;
  ulong local_38;
  
  uVar11 = (block_size + w + -1) / block_size;
  uVar12 = (block_size + h + -1) / block_size;
  if (block_size < 2) {
    fprintf(_stderr,"block_size = %d must be > 1\n",(ulong)(uint)block_size);
  }
  else {
    uVar30 = (noise_model->params).lag * 2;
    if ((int)uVar30 < block_size) {
      local_50 = (byte *)(chroma_sub_log2 + 1);
      lVar54 = 0;
      do {
        lVar32 = (long)*(int *)((long)&noise_model->latest_state[0].eqns.n + lVar54);
        sVar2 = lVar32 * 8;
        memset(*(void **)((long)&noise_model->latest_state[0].eqns.A + lVar54),0,lVar32 * sVar2);
        memset(*(void **)((long)&noise_model->latest_state[0].eqns.x + lVar54),0,sVar2);
        memset(*(void **)((long)&noise_model->latest_state[0].eqns.b + lVar54),0,sVar2);
        *(undefined4 *)((long)&noise_model->latest_state[0].num_observations + lVar54) = 0;
        lVar32 = (long)*(int *)((long)&noise_model->latest_state[0].strength_solver.eqns.n + lVar54)
        ;
        sVar2 = lVar32 * 8;
        memset(*(void **)((long)&noise_model->latest_state[0].strength_solver.eqns.A + lVar54),0,
               lVar32 * sVar2);
        memset(*(void **)((long)&noise_model->latest_state[0].strength_solver.eqns.x + lVar54),0,
               sVar2);
        memset(*(void **)((long)&noise_model->latest_state[0].strength_solver.eqns.b + lVar54),0,
               sVar2);
        *(undefined4 *)((long)&noise_model->latest_state[0].strength_solver.num_equations + lVar54)
             = 0;
        *(undefined8 *)((long)&noise_model->latest_state[0].strength_solver.total + lVar54) = 0;
        lVar54 = lVar54 + 0x70;
      } while (lVar54 != 0x150);
      if (0 < (int)(uVar12 * uVar11)) {
        uVar27 = 0;
        uVar30 = 0;
        do {
          uVar30 = (uVar30 + 1) - (uint)(flat_blocks[uVar27] == '\0');
          uVar27 = uVar27 + 1;
        } while (uVar12 * uVar11 != uVar27);
        if (1 < uVar30) {
          local_80 = noise_model->latest_state;
          local_48 = (long)(int)uVar11;
          local_78 = (ulong)uVar12;
          uVar27 = (ulong)uVar11;
          local_70 = local_48 + -1;
          local_88 = noise_model->combined_state;
          lVar54 = 0;
          bVar8 = false;
          do {
            local_8c = 0;
            local_90[0] = 0;
            local_90[1] = 0;
            local_90[2] = 0;
            local_90[3] = 0;
            if (lVar54 == 0) {
              puVar53 = (uint8_t *)0x0;
              local_180 = local_90;
              local_128 = &local_8c;
              puVar55 = (uint8_t *)0x0;
            }
            else {
              puVar53 = *data;
              puVar55 = *denoised;
              local_180 = local_50;
              local_128 = chroma_sub_log2;
            }
            puVar33 = data[lVar54];
            iVar15 = 8;
            if ((puVar33 != (uint8_t *)0x0) &&
               (puVar46 = denoised[lVar54], puVar46 != (uint8_t *)0x0)) {
              iVar15 = stride[lVar54];
              iVar3 = *stride;
              uVar30 = (noise_model->params).lag;
              uVar45 = noise_model->n;
              lVar32 = (long)(int)uVar45;
              iVar14 = (noise_model->params).bit_depth;
              state = local_80 + lVar54;
              pdVar29 = local_80[lVar54].eqns.A;
              pdVar5 = local_80[lVar54].eqns.b;
              memblk = aom_malloc(lVar32 * 8 + 8);
              if (memblk == (void *)0x0) {
                fprintf(_stderr,"Unable to allocate buffer of size %d\n",lVar32 + 1);
              }
              else {
                if (0 < (int)uVar12) {
                  dVar56 = (double)~(-1 << ((byte)iVar14 & 0x1f));
                  uVar47 = local_80[lVar54].eqns.n;
                  uVar51 = (ulong)uVar47;
                  bVar19 = puVar55 != (uint8_t *)0x0 && puVar53 != (uint8_t *)0x0;
                  dVar56 = dVar56 * dVar56;
                  iVar14 = 0;
                  local_140 = 0;
                  do {
                    bVar24 = *local_180;
                    if (0 < (int)uVar11) {
                      lVar40 = local_140 * local_48;
                      local_40 = (local_140 - 1) * local_48;
                      uVar42 = 0;
                      do {
                        uVar36 = (uint)block_size >> ((byte)*local_128 & 0x1f);
                        if (flat_blocks[lVar40 + uVar42] != '\0') {
                          if ((local_140 == 0) ||
                             (uVar26 = 0, flat_blocks[local_40 + uVar42] == '\0')) {
                            uVar26 = uVar30;
                          }
                          if ((uVar42 == 0) ||
                             (uVar31 = 0, flat_blocks[lVar40 + (uVar42 - 1)] == '\0')) {
                            uVar31 = uVar30;
                          }
                          iVar49 = h >> (*local_180 & 0x1f);
                          uVar52 = (uint)block_size >> (*local_180 & 0x1f);
                          uVar34 = iVar49 - uVar52 * (int)local_140;
                          if ((int)uVar52 <= (int)uVar34) {
                            uVar34 = uVar52;
                          }
                          if ((local_70 <= (long)uVar42) ||
                             (uVar25 = uVar36, flat_blocks[lVar40 + uVar42 + 1] == '\0')) {
                            uVar25 = uVar36 - uVar30;
                          }
                          iVar13 = uVar36 * (int)uVar42;
                          uVar43 = ((w >> ((byte)*local_128 & 0x1f)) - uVar30) - iVar13;
                          if (((int)uVar25 <= (int)uVar43) &&
                             ((local_70 <= (long)uVar42 ||
                              (uVar43 = uVar36, flat_blocks[lVar40 + uVar42 + 1] == '\0')))) {
                            uVar43 = uVar36 - uVar30;
                          }
                          if ((int)uVar26 < (int)uVar34) {
                            local_68 = (double)(long)iVar13;
                            local_160 = (ulong)(int)uVar26;
                            uVar37 = (ulong)(int)(iVar49 + uVar52 * iVar14);
                            if ((long)(ulong)uVar52 < (long)uVar37) {
                              uVar37 = (ulong)uVar52;
                            }
                            do {
                              if ((int)uVar31 < (int)uVar43) {
                                iVar49 = (noise_model->params).use_highbd;
                                lVar38 = ((uint)block_size >> (bVar24 & 0x1f)) * local_140 +
                                         local_160;
                                lVar39 = lVar38 * iVar15;
                                paiVar6 = noise_model->coords;
                                lVar41 = (long)(int)uVar31;
                                do {
                                  lVar17 = lVar41 + (long)local_68;
                                  iVar13 = (int)lVar17;
                                  iVar35 = (int)lVar38;
                                  if (iVar49 == 0) {
                                    if (0 < (int)uVar45) {
                                      uVar16 = 0;
                                      do {
                                        iVar50 = (paiVar6[uVar16][1] + iVar35) * iVar15 +
                                                 paiVar6[uVar16][0] + iVar13;
                                        *(double *)((long)memblk + uVar16 * 8) =
                                             (double)puVar33[iVar50] - (double)puVar46[iVar50];
                                        uVar16 = uVar16 + 1;
                                      } while (uVar45 != uVar16);
                                    }
                                    lVar17 = lVar39 + lVar17;
                                    bVar21 = puVar33[lVar17];
                                    bVar20 = puVar46[lVar17];
                                    if (bVar19) {
                                      dVar58 = NAN;
                                      if (*(int *)local_180 != 0x1f) {
                                        bVar22 = (byte)*(int *)local_180;
                                        iVar50 = 1 << (bVar22 & 0x1f);
                                        bVar23 = (byte)*local_128;
                                        uVar36 = 1 << (bVar23 & 0x1f);
                                        bVar23 = bVar23 & 0x1f;
                                        if ((int)uVar36 < 2) {
                                          uVar36 = 1;
                                        }
                                        if (iVar50 < 2) {
                                          iVar50 = 1;
                                        }
                                        iVar13 = (iVar35 << (bVar22 & 0x1f)) * iVar3 +
                                                 (iVar13 << bVar23);
                                        iVar35 = 0 << bVar23;
                                        dVar58 = 0.0;
                                        iVar44 = 0;
                                        dVar59 = 0.0;
                                        do {
                                          uVar16 = (ulong)uVar36;
                                          iVar4 = iVar13;
                                          if (*local_128 != 0x1f) {
                                            do {
                                              dVar58 = dVar58 + (double)puVar53[iVar4];
                                              dVar59 = dVar59 + (double)puVar55[iVar4];
                                              uVar16 = uVar16 - 1;
                                              iVar4 = iVar4 + 1;
                                            } while (uVar16 != 0);
                                            iVar44 = iVar44 + uVar36;
                                          }
                                          iVar35 = iVar35 + 1;
                                          iVar13 = iVar13 + iVar3;
                                        } while (iVar35 != iVar50);
                                        dVar58 = (dVar58 - dVar59) / (double)iVar44;
                                      }
                                      *(double *)((long)memblk + lVar32 * 8) = dVar58;
                                    }
                                    uVar10 = (ushort)bVar20;
                                    uVar9 = (ushort)bVar21;
                                  }
                                  else {
                                    if (0 < (int)uVar45) {
                                      uVar16 = 0;
                                      do {
                                        lVar28 = (long)((paiVar6[uVar16][1] + iVar35) * iVar15 +
                                                       paiVar6[uVar16][0] + iVar13);
                                        *(double *)((long)memblk + uVar16 * 8) =
                                             (double)*(ushort *)(puVar33 + lVar28 * 2) -
                                             (double)*(ushort *)(puVar46 + lVar28 * 2);
                                        uVar16 = uVar16 + 1;
                                      } while (uVar45 != uVar16);
                                    }
                                    lVar17 = lVar39 + lVar17;
                                    uVar9 = *(ushort *)(puVar33 + lVar17 * 2);
                                    uVar10 = *(ushort *)(puVar46 + lVar17 * 2);
                                    if (bVar19) {
                                      dVar58 = NAN;
                                      if (*(int *)local_180 != 0x1f) {
                                        bVar20 = (byte)*(int *)local_180;
                                        iVar50 = 1 << (bVar20 & 0x1f);
                                        bVar21 = (byte)*local_128;
                                        uVar36 = 1 << (bVar21 & 0x1f);
                                        bVar21 = bVar21 & 0x1f;
                                        uVar16 = (ulong)uVar36;
                                        if ((int)uVar36 < 2) {
                                          uVar16 = 1;
                                        }
                                        if (iVar50 < 2) {
                                          iVar50 = 1;
                                        }
                                        iVar13 = (iVar35 << (bVar20 & 0x1f)) * iVar3 +
                                                 (iVar13 << bVar21);
                                        dVar58 = 0.0;
                                        dVar59 = 0.0;
                                        iVar35 = 0;
                                        iVar44 = 0 << bVar21;
                                        do {
                                          uVar48 = uVar16;
                                          iVar4 = iVar13;
                                          if (*local_128 != 0x1f) {
                                            do {
                                              dVar58 = dVar58 + (double)*(ushort *)
                                                                         (puVar55 + (long)iVar4 * 2)
                                              ;
                                              dVar59 = dVar59 + (double)*(ushort *)
                                                                         (puVar53 + (long)iVar4 * 2)
                                              ;
                                              uVar48 = uVar48 - 1;
                                              iVar4 = iVar4 + 1;
                                            } while (uVar48 != 0);
                                            iVar44 = iVar44 + (int)uVar16;
                                          }
                                          iVar35 = iVar35 + 1;
                                          iVar13 = iVar13 + iVar3;
                                        } while (iVar35 != iVar50);
                                        dVar58 = (dVar59 - dVar58) / (double)iVar44;
                                      }
                                      *(double *)((long)memblk + lVar32 * 8) = dVar58;
                                    }
                                  }
                                  if (0 < (int)uVar47) {
                                    uVar16 = 0;
                                    pdVar18 = pdVar29;
                                    do {
                                      uVar48 = 0;
                                      do {
                                        pdVar18[uVar48] =
                                             (*(double *)((long)memblk + uVar16 * 8) *
                                             *(double *)((long)memblk + uVar48 * 8)) / dVar56 +
                                             pdVar18[uVar48];
                                        uVar48 = uVar48 + 1;
                                      } while (uVar51 != uVar48);
                                      pdVar5[uVar16] =
                                           (*(double *)((long)memblk + uVar16 * 8) *
                                           ((double)uVar9 - (double)uVar10)) / dVar56 +
                                           pdVar5[uVar16];
                                      uVar16 = uVar16 + 1;
                                      pdVar18 = pdVar18 + uVar51;
                                    } while (uVar16 != uVar51);
                                  }
                                  state->num_observations = state->num_observations + 1;
                                  lVar41 = lVar41 + 1;
                                } while (lVar41 != (int)uVar43);
                              }
                              local_160 = local_160 + 1;
                            } while (local_160 != uVar37);
                          }
                        }
                        uVar42 = uVar42 + 1;
                      } while (uVar42 != uVar27);
                    }
                    local_140 = local_140 + 1;
                    iVar14 = iVar14 + -1;
                  } while (local_140 != local_78);
                }
                local_38 = (ulong)uVar30;
                aom_free(memblk);
              }
              if (memblk == (void *)0x0) {
                aom_noise_model_update_cold_5();
              }
              else {
                iVar15 = ar_equation_system_solve(state,(uint)(lVar54 != 0));
                if (iVar15 == 0) {
                  if (lVar54 == 0) {
                    aom_noise_model_update_cold_1();
                    goto LAB_002a364f;
                  }
                  set_chroma_coefficient_fallback_soln(&state->eqns);
                }
                solver = &state->strength_solver;
                if (0 < (int)uVar12) {
                  puVar55 = data[lVar54];
                  iVar15 = stride[lVar54];
                  lVar32 = (long)iVar15;
                  local_110 = puVar55;
                  if (puVar53 != (uint8_t *)0x0) {
                    iVar15 = *stride;
                    local_110 = puVar53;
                  }
                  puVar53 = denoised[lVar54];
                  dVar56 = noise_model->latest_state[0].ar_gain;
                  dVar58 = state->ar_gain;
                  pdVar29 = (state->eqns).x;
                  iVar3 = noise_model->n;
                  lVar40 = (long)iVar15;
                  uVar51 = 0;
                  do {
                    if (0 < (int)uVar11) {
                      iVar14 = ((uint)block_size >> (*local_180 & 0x1f)) * (int)uVar51;
                      lVar41 = iVar14 * lVar32;
                      iVar15 = 0;
                      uVar42 = 0;
                      do {
                        bVar24 = (byte)*local_128;
                        uVar30 = (uint)block_size >> (bVar24 & 0x1f);
                        if (flat_blocks[uVar42 + uVar51 * uVar27] != '\0') {
                          iVar13 = uVar30 * (int)uVar42;
                          bVar20 = (byte)*(undefined4 *)local_180;
                          iVar49 = h >> (bVar20 & 0x1f);
                          bVar21 = bVar20 & 0x1f;
                          uVar47 = (uint)block_size >> bVar21;
                          uVar45 = iVar49 - uVar47 * (int)uVar51;
                          if ((int)uVar47 <= (int)uVar45) {
                            uVar45 = uVar47;
                          }
                          iVar35 = w >> (bVar24 & 0x1f);
                          uVar36 = iVar35 - iVar13;
                          if ((int)uVar30 <= iVar35 - iVar13) {
                            uVar36 = uVar30;
                          }
                          if (block_size < (int)(uVar45 * uVar36)) {
                            iVar44 = iVar13 << (bVar24 & 0x1f);
                            iVar50 = iVar14 << (bVar20 & 0x1f);
                            uVar26 = h - iVar50;
                            uVar45 = block_size;
                            if ((int)uVar26 < block_size) {
                              uVar45 = uVar26;
                            }
                            iVar4 = (noise_model->params).use_highbd;
                            uVar34 = w - iVar44;
                            uVar31 = block_size;
                            if ((int)uVar34 < block_size) {
                              uVar31 = uVar34;
                            }
                            if (iVar4 == 0) {
                              if ((int)uVar26 < 1) goto LAB_002a303f;
                              uVar37 = 1;
                              if (1 < (int)uVar31) {
                                uVar37 = (ulong)uVar31;
                              }
                              puVar33 = local_110 + (long)iVar44 + iVar50 * lVar40;
                              dVar59 = 0.0;
                              uVar16 = 0;
                              do {
                                if (0 < (int)uVar34) {
                                  uVar48 = 0;
                                  do {
                                    dVar59 = dVar59 + (double)puVar33[uVar48];
                                    uVar48 = uVar48 + 1;
                                  } while (uVar37 != uVar48);
                                }
                                uVar16 = uVar16 + 1;
                                puVar33 = puVar33 + lVar40;
                              } while (uVar16 != uVar45);
                            }
                            else if ((int)uVar26 < 1) {
LAB_002a303f:
                              dVar59 = 0.0;
                            }
                            else {
                              uVar37 = 1;
                              if (1 < (int)uVar31) {
                                uVar37 = (ulong)uVar31;
                              }
                              puVar33 = local_110 + (long)iVar50 * lVar40 * 2 + (long)iVar44 * 2;
                              dVar59 = 0.0;
                              uVar16 = 0;
                              do {
                                if (0 < (int)uVar34) {
                                  uVar48 = 0;
                                  do {
                                    dVar59 = dVar59 + (double)*(ushort *)(puVar33 + uVar48 * 2);
                                    uVar48 = uVar48 + 1;
                                  } while (uVar37 != uVar48);
                                }
                                uVar16 = uVar16 + 1;
                                puVar33 = puVar33 + lVar40 * 2;
                              } while (uVar16 != uVar45);
                            }
                            uVar26 = iVar49 - iVar14;
                            if ((int)uVar47 <= (int)uVar26) {
                              uVar26 = uVar47;
                            }
                            if (iVar4 == 0) {
                              if ((int)uVar26 < 1) goto LAB_002a3188;
                              uVar47 = iVar35 + uVar30 * iVar15;
                              if ((int)uVar30 < (int)uVar47) {
                                uVar47 = uVar30;
                              }
                              puVar33 = puVar53 + iVar13 + lVar41;
                              puVar46 = puVar55 + iVar13 + lVar41;
                              dVar60 = 0.0;
                              uVar37 = (ulong)(0 >> bVar21);
                              dVar61 = 0.0;
                              do {
                                if (0 < (int)uVar36) {
                                  uVar16 = 0;
                                  do {
                                    dVar57 = (double)puVar46[uVar16] - (double)puVar33[uVar16];
                                    dVar61 = dVar61 + dVar57;
                                    dVar60 = dVar60 + dVar57 * dVar57;
                                    uVar16 = uVar16 + 1;
                                  } while (uVar47 != uVar16);
                                }
                                uVar37 = uVar37 + 1;
                                puVar33 = puVar33 + lVar32;
                                puVar46 = puVar46 + lVar32;
                              } while (uVar37 != uVar26);
                            }
                            else if ((int)uVar26 < 1) {
LAB_002a3188:
                              dVar61 = 0.0;
                              dVar60 = 0.0;
                            }
                            else {
                              uVar47 = iVar35 + uVar30 * iVar15;
                              if ((int)uVar30 < (int)uVar47) {
                                uVar47 = uVar30;
                              }
                              puVar33 = puVar53 + (iVar13 + lVar41) * 2;
                              puVar46 = puVar55 + (iVar13 + lVar41) * 2;
                              dVar60 = 0.0;
                              uVar37 = (ulong)(0 >> bVar21);
                              dVar61 = 0.0;
                              do {
                                if (0 < (int)uVar36) {
                                  uVar16 = 0;
                                  do {
                                    dVar57 = (double)*(ushort *)(puVar46 + uVar16 * 2) -
                                             (double)*(ushort *)(puVar33 + uVar16 * 2);
                                    dVar61 = dVar61 + dVar57;
                                    dVar60 = dVar60 + dVar57 * dVar57;
                                    uVar16 = uVar16 + 1;
                                  } while (uVar47 != uVar16);
                                }
                                uVar37 = uVar37 + 1;
                                puVar33 = puVar33 + lVar32 * 2;
                                puVar46 = puVar46 + lVar32 * 2;
                              } while (uVar37 != uVar26);
                            }
                            dVar59 = dVar59 / (double)(int)(uVar45 * uVar31);
                            dVar57 = 0.0;
                            if (lVar54 != 0) {
                              dVar57 = noise_model->latest_state[0].strength_solver.min_intensity;
                              dVar62 = noise_model->latest_state[0].strength_solver.max_intensity;
                              dVar7 = dVar62;
                              if (dVar59 <= dVar62) {
                                dVar7 = dVar59;
                              }
                              iVar13 = noise_model->latest_state[0].strength_solver.num_bins;
                              iVar35 = iVar13 + -1;
                              local_68 = (((double)(-(ulong)(dVar59 < dVar57) & (ulong)dVar57 |
                                                   ~-(ulong)(dVar59 < dVar57) & (ulong)dVar7) -
                                          dVar57) * (double)iVar35) / (dVar62 - dVar57);
                              uStack_60 = 0;
                              dVar57 = floor(local_68);
                              iVar49 = (int)dVar57 + 1;
                              if (iVar49 < iVar13) {
                                iVar35 = iVar49;
                              }
                              pdVar5 = noise_model->latest_state[0].strength_solver.eqns.x;
                              dVar57 = ((1.0 - (local_68 - (double)(int)dVar57)) *
                                        pdVar5[(int)dVar57] +
                                       (local_68 - (double)(int)dVar57) * pdVar5[iVar35]) * dVar56;
                            }
                            dVar62 = 0.0;
                            if (lVar54 != 0) {
                              dVar62 = pdVar29[iVar3];
                            }
                            dVar61 = dVar61 / (double)(int)(uVar26 * uVar36);
                            dVar61 = dVar60 / (double)(int)(uVar26 * uVar36) - dVar61 * dVar61;
                            dVar60 = dVar61 * 0.0625;
                            dVar61 = dVar61 - dVar57 * dVar62 * dVar57 * dVar62;
                            if (dVar60 <= dVar61) {
                              dVar60 = dVar61;
                            }
                            if (dVar60 < 0.0) {
                              dVar60 = sqrt(dVar60);
                            }
                            else {
                              dVar60 = SQRT(dVar60);
                            }
                            aom_noise_strength_solver_add_measurement(solver,dVar59,dVar60 / dVar58)
                            ;
                          }
                        }
                        uVar42 = uVar42 + 1;
                        iVar15 = iVar15 + -1;
                      } while (uVar42 != uVar27);
                    }
                    uVar51 = uVar51 + 1;
                  } while (uVar51 != local_78);
                }
                iVar15 = aom_noise_strength_solver_solve(solver);
                if (iVar15 != 0) {
                  bVar19 = bVar8;
                  if ((lVar54 == 0) && (0 < (local_88->strength_solver).num_equations)) {
                    iVar15 = (noise_model->params).bit_depth;
                    dVar56 = aom_normalized_cross_correlation
                                       (noise_model->latest_state[0].eqns.x,
                                        noise_model->combined_state[0].eqns.x,
                                        noise_model->combined_state[0].eqns.n);
                    bVar19 = true;
                    if (0.9 <= dVar56) {
                      iVar3 = noise_model->latest_state[0].strength_solver.num_bins;
                      uVar30 = noise_model->latest_state[0].strength_solver.eqns.n;
                      uVar51 = (ulong)uVar30;
                      if ((int)uVar30 < 1) {
                        dVar56 = 0.0;
                        dVar58 = 0.0;
                      }
                      else {
                        dVar58 = 0.0;
                        lVar32 = 0;
                        lVar40 = 0;
                        dVar56 = 0.0;
                        do {
                          dVar59 = 0.0;
                          if (0 < (int)uVar51) {
                            pdVar29 = (double *)
                                      ((long)noise_model->latest_state[0].strength_solver.eqns.A +
                                      lVar32);
                            uVar42 = uVar51 & 0xffffffff;
                            do {
                              dVar59 = dVar59 + *pdVar29;
                              pdVar29 = pdVar29 + (uVar51 & 0xffffffff);
                              uVar42 = uVar42 - 1;
                            } while (uVar42 != 0);
                          }
                          if (dVar59 < 0.0) {
                            dVar59 = sqrt(dVar59);
                          }
                          else {
                            dVar59 = SQRT(dVar59);
                          }
                          dVar56 = dVar56 + ABS(noise_model->latest_state[0].strength_solver.eqns.x
                                                [lVar40] -
                                                noise_model->combined_state[0].strength_solver.eqns.
                                                x[lVar40]) * dVar59;
                          dVar58 = dVar58 + dVar59;
                          lVar40 = lVar40 + 1;
                          uVar51 = (ulong)noise_model->latest_state[0].strength_solver.eqns.n;
                          lVar32 = lVar32 + 8;
                        } while (lVar40 < (long)uVar51);
                      }
                      if (((1.0 / (double)iVar3) * dVar56) / dVar58 <=
                          (double)(1 << ((char)iVar15 - 8U & 0x1f)) * 0.005) {
                        bVar19 = bVar8;
                      }
                    }
                  }
                  if (bVar19) {
                    bVar8 = true;
                    iVar15 = 10;
                    goto LAB_002a3660;
                  }
                  state_00 = local_88 + lVar54;
                  local_88[lVar54].num_observations =
                       local_88[lVar54].num_observations + state->num_observations;
                  equation_system_add(&state_00->eqns,&state->eqns);
                  iVar15 = ar_equation_system_solve(state_00,(uint)(lVar54 != 0));
                  if (iVar15 == 0) {
                    if (lVar54 != 0) {
                      set_chroma_coefficient_fallback_soln(&state_00->eqns);
                      goto LAB_002a358b;
                    }
                    aom_noise_model_update_cold_2();
                  }
                  else {
LAB_002a358b:
                    equation_system_add(&(state_00->strength_solver).eqns,&solver->eqns);
                    piVar1 = &(state_00->strength_solver).num_equations;
                    *piVar1 = *piVar1 + (state->strength_solver).num_equations;
                    (state_00->strength_solver).total =
                         (state->strength_solver).total + (state_00->strength_solver).total;
                    iVar15 = aom_noise_strength_solver_solve(&state_00->strength_solver);
                    bVar8 = false;
                    if (iVar15 != 0) {
                      iVar15 = 0;
                      goto LAB_002a3660;
                    }
                    aom_noise_model_update_cold_3();
                  }
                  bVar8 = false;
                  iVar15 = 1;
                  goto LAB_002a3660;
                }
                aom_noise_model_update_cold_4();
              }
LAB_002a364f:
              iVar15 = 1;
            }
LAB_002a3660:
            if ((iVar15 != 0) && (iVar15 != 10)) {
              if (iVar15 != 8) {
                return '\x04';
              }
              goto LAB_002a369c;
            }
            lVar54 = lVar54 + 1;
            if (lVar54 == 3) {
LAB_002a369c:
              return bVar8 * '\x03';
            }
          } while( true );
        }
      }
      aom_noise_model_update_cold_6();
      return '\x02';
    }
    fprintf(_stderr,"block_size = %d must be >= %d\n",(ulong)(uint)block_size,(ulong)(uVar30 | 1));
  }
  return '\x01';
}

Assistant:

aom_noise_status_t aom_noise_model_update(
    aom_noise_model_t *const noise_model, const uint8_t *const data[3],
    const uint8_t *const denoised[3], int w, int h, int stride[3],
    int chroma_sub_log2[2], const uint8_t *const flat_blocks, int block_size) {
  const int num_blocks_w = (w + block_size - 1) / block_size;
  const int num_blocks_h = (h + block_size - 1) / block_size;
  int y_model_different = 0;
  int num_blocks = 0;
  int i = 0, channel = 0;

  if (block_size <= 1) {
    fprintf(stderr, "block_size = %d must be > 1\n", block_size);
    return AOM_NOISE_STATUS_INVALID_ARGUMENT;
  }

  if (block_size < noise_model->params.lag * 2 + 1) {
    fprintf(stderr, "block_size = %d must be >= %d\n", block_size,
            noise_model->params.lag * 2 + 1);
    return AOM_NOISE_STATUS_INVALID_ARGUMENT;
  }

  // Clear the latest equation system
  for (i = 0; i < 3; ++i) {
    equation_system_clear(&noise_model->latest_state[i].eqns);
    noise_model->latest_state[i].num_observations = 0;
    noise_strength_solver_clear(&noise_model->latest_state[i].strength_solver);
  }

  // Check that we have enough flat blocks
  for (i = 0; i < num_blocks_h * num_blocks_w; ++i) {
    if (flat_blocks[i]) {
      num_blocks++;
    }
  }

  if (num_blocks <= 1) {
    fprintf(stderr, "Not enough flat blocks to update noise estimate\n");
    return AOM_NOISE_STATUS_INSUFFICIENT_FLAT_BLOCKS;
  }

  for (channel = 0; channel < 3; ++channel) {
    int no_subsampling[2] = { 0, 0 };
    const uint8_t *alt_data = channel > 0 ? data[0] : 0;
    const uint8_t *alt_denoised = channel > 0 ? denoised[0] : 0;
    int *sub = channel > 0 ? chroma_sub_log2 : no_subsampling;
    const int is_chroma = channel != 0;
    if (!data[channel] || !denoised[channel]) break;
    if (!add_block_observations(noise_model, channel, data[channel],
                                denoised[channel], w, h, stride[channel], sub,
                                alt_data, alt_denoised, stride[0], flat_blocks,
                                block_size, num_blocks_w, num_blocks_h)) {
      fprintf(stderr, "Adding block observation failed\n");
      return AOM_NOISE_STATUS_INTERNAL_ERROR;
    }

    if (!ar_equation_system_solve(&noise_model->latest_state[channel],
                                  is_chroma)) {
      if (is_chroma) {
        set_chroma_coefficient_fallback_soln(
            &noise_model->latest_state[channel].eqns);
      } else {
        fprintf(stderr, "Solving latest noise equation system failed %d!\n",
                channel);
        return AOM_NOISE_STATUS_INTERNAL_ERROR;
      }
    }

    add_noise_std_observations(
        noise_model, channel, noise_model->latest_state[channel].eqns.x,
        data[channel], denoised[channel], w, h, stride[channel], sub, alt_data,
        stride[0], flat_blocks, block_size, num_blocks_w, num_blocks_h);

    if (!aom_noise_strength_solver_solve(
            &noise_model->latest_state[channel].strength_solver)) {
      fprintf(stderr, "Solving latest noise strength failed!\n");
      return AOM_NOISE_STATUS_INTERNAL_ERROR;
    }

    // Check noise characteristics and return if error.
    if (channel == 0 &&
        noise_model->combined_state[channel].strength_solver.num_equations >
            0 &&
        is_noise_model_different(noise_model)) {
      y_model_different = 1;
    }

    // Don't update the combined stats if the y model is different.
    if (y_model_different) continue;

    noise_model->combined_state[channel].num_observations +=
        noise_model->latest_state[channel].num_observations;
    equation_system_add(&noise_model->combined_state[channel].eqns,
                        &noise_model->latest_state[channel].eqns);
    if (!ar_equation_system_solve(&noise_model->combined_state[channel],
                                  is_chroma)) {
      if (is_chroma) {
        set_chroma_coefficient_fallback_soln(
            &noise_model->combined_state[channel].eqns);
      } else {
        fprintf(stderr, "Solving combined noise equation system failed %d!\n",
                channel);
        return AOM_NOISE_STATUS_INTERNAL_ERROR;
      }
    }

    noise_strength_solver_add(
        &noise_model->combined_state[channel].strength_solver,
        &noise_model->latest_state[channel].strength_solver);

    if (!aom_noise_strength_solver_solve(
            &noise_model->combined_state[channel].strength_solver)) {
      fprintf(stderr, "Solving combined noise strength failed!\n");
      return AOM_NOISE_STATUS_INTERNAL_ERROR;
    }
  }

  return y_model_different ? AOM_NOISE_STATUS_DIFFERENT_NOISE_TYPE
                           : AOM_NOISE_STATUS_OK;
}